

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O0

_Bool Curl_tls_keylog_write(char *label,uchar *client_random,uchar *secret,size_t secretlen)

{
  size_t __n;
  char local_118 [8];
  char line [195];
  ulong local_48;
  size_t i;
  size_t pos;
  char *hex;
  size_t secretlen_local;
  uchar *secret_local;
  uchar *client_random_local;
  char *label_local;
  
  if (keylog_file_fp == (FILE *)0x0) {
    label_local._7_1_ = false;
  }
  else {
    __n = strlen(label);
    if (((__n < 0x20) && (secretlen != 0)) && (secretlen < 0x31)) {
      memcpy(local_118,label,__n);
      local_118[__n] = ' ';
      i = __n + 1;
      for (local_48 = 0; local_48 < 0x20; local_48 = local_48 + 1) {
        local_118[i] = "0123456789ABCDEF"[(int)(uint)client_random[local_48] >> 4];
        local_118[i + 1] = "0123456789ABCDEF"[(int)(client_random[local_48] & 0xf)];
        i = i + 2;
      }
      local_118[i] = ' ';
      i = i + 1;
      for (local_48 = 0; local_48 < secretlen; local_48 = local_48 + 1) {
        local_118[i] = "0123456789ABCDEF"[(int)(uint)secret[local_48] >> 4];
        local_118[i + 1] = "0123456789ABCDEF"[(int)(secret[local_48] & 0xf)];
        i = i + 2;
      }
      local_118[i] = '\n';
      local_118[i + 1] = '\0';
      fputs(local_118,(FILE *)keylog_file_fp);
      label_local._7_1_ = true;
    }
    else {
      label_local._7_1_ = false;
    }
  }
  return label_local._7_1_;
}

Assistant:

bool
Curl_tls_keylog_write(const char *label,
                      const unsigned char client_random[CLIENT_RANDOM_SIZE],
                      const unsigned char *secret, size_t secretlen)
{
  const char *hex = "0123456789ABCDEF";
  size_t pos, i;
  char line[KEYLOG_LABEL_MAXLEN + 1 + 2 * CLIENT_RANDOM_SIZE + 1 +
            2 * SECRET_MAXLEN + 1 + 1];

  if(!keylog_file_fp) {
    return false;
  }

  pos = strlen(label);
  if(pos > KEYLOG_LABEL_MAXLEN || !secretlen || secretlen > SECRET_MAXLEN) {
    /* Should never happen - sanity check anyway. */
    return false;
  }

  memcpy(line, label, pos);
  line[pos++] = ' ';

  /* Client Random */
  for(i = 0; i < CLIENT_RANDOM_SIZE; i++) {
    line[pos++] = hex[client_random[i] >> 4];
    line[pos++] = hex[client_random[i] & 0xF];
  }
  line[pos++] = ' ';

  /* Secret */
  for(i = 0; i < secretlen; i++) {
    line[pos++] = hex[secret[i] >> 4];
    line[pos++] = hex[secret[i] & 0xF];
  }
  line[pos++] = '\n';
  line[pos] = '\0';

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  fputs(line, keylog_file_fp);
  return true;
}